

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O1

unique_ptr<Sock,_std::default_delete<Sock>_> __thiscall
Sock::Accept(Sock *this,sockaddr *addr,socklen_t *addr_len)

{
  long lVar1;
  SOCKET s;
  Sock *this_00;
  socklen_t *in_RCX;
  pointer *__ptr;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_Sock = (_func_int **)0x0;
  s = accept(*(int *)(addr->sa_data + 6),(sockaddr *)addr_len,in_RCX);
  if (s != 0xffffffff) {
    this_00 = (Sock *)operator_new(0x10);
    Sock(this_00,s);
    this->_vptr_Sock = (_func_int **)this_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)
           (__uniq_ptr_data<Sock,_std::default_delete<Sock>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Sock> Sock::Accept(sockaddr* addr, socklen_t* addr_len) const
{
#ifdef WIN32
    static constexpr auto ERR = INVALID_SOCKET;
#else
    static constexpr auto ERR = SOCKET_ERROR;
#endif

    std::unique_ptr<Sock> sock;

    const auto socket = accept(m_socket, addr, addr_len);
    if (socket != ERR) {
        try {
            sock = std::make_unique<Sock>(socket);
        } catch (const std::exception&) {
#ifdef WIN32
            closesocket(socket);
#else
            close(socket);
#endif
        }
    }

    return sock;
}